

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_hdr.c
# Opt level: O0

int tool_write_headers(HdrCbData *hdrcbdata,FILE *stream)

{
  size_t __n;
  size_t sVar1;
  size_t len;
  curl_slist *pcStack_20;
  int rc;
  curl_slist *h;
  FILE *stream_local;
  HdrCbData *hdrcbdata_local;
  
  pcStack_20 = hdrcbdata->headlist;
  len._4_4_ = 1;
  for (; pcStack_20 != (curl_slist *)0x0; pcStack_20 = pcStack_20->next) {
    __n = strlen(pcStack_20->data);
    sVar1 = fwrite(pcStack_20->data,1,__n,(FILE *)stream);
    if (__n != sVar1) goto LAB_0010b54e;
  }
  len._4_4_ = 0;
LAB_0010b54e:
  curl_slist_free_all(hdrcbdata->headlist);
  hdrcbdata->headlist = (curl_slist *)0x0;
  return len._4_4_;
}

Assistant:

int tool_write_headers(struct HdrCbData *hdrcbdata, FILE *stream)
{
  struct curl_slist *h = hdrcbdata->headlist;
  int rc = 1;
  while(h) {
    /* not "handled", just show it */
    size_t len = strlen(h->data);
    if(len != fwrite(h->data, 1, len, stream))
      goto fail;
    h = h->next;
  }
  rc = 0; /* success */
fail:
  curl_slist_free_all(hdrcbdata->headlist);
  hdrcbdata->headlist = NULL;
  return rc;
}